

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nested.cpp
# Opt level: O3

tuple<NS_*> test_graphs::double_nested(void)

{
  NS *pNVar1;
  NS *graph;
  NS *graph_00;
  NS *graph_01;
  NS *graph_02;
  N *this;
  N *this_00;
  N *this_01;
  N *this_02;
  undefined8 *puVar2;
  N *this_03;
  int iVar3;
  NS *in_RDI;
  N *local_50;
  NS *local_48;
  N *local_40;
  _Tuple_impl<0UL,_NS_*> local_38;
  
  local_38.super__Head_base<0UL,_NS_*,_false>._M_head_impl =
       (_Head_base<0UL,_NS_*,_false>)(_Head_base<0UL,_NS_*,_false>)in_RDI;
  pNVar1 = (NS *)operator_new(0x18);
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48 = pNVar1;
  graph = (NS *)operator_new(0x18);
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  graph_00 = (NS *)operator_new(0x18);
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  graph_01 = (NS *)operator_new(0x18);
  (graph_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  graph_02 = (NS *)operator_new(0x18);
  (graph_02->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph_02->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph_02->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (N *)N::operator_new(0x78,pNVar1);
  (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(NS **)&(this->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u =
       graph;
  *(__index_type *)
   ((long)&(this->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x03';
  this_00 = (N *)N::operator_new(0x78,pNVar1);
  (this_00->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this_00->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(NS **)&(this_00->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u =
       graph_00;
  *(__index_type *)
   ((long)&(this_00->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x03';
  this_01 = (N *)N::operator_new(0x78,graph);
  (this_01->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_01->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_01->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this_01->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_01->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_01->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(NS **)&(this_01->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u =
       graph_01;
  *(__index_type *)
   ((long)&(this_01->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x03';
  this_02 = (N *)N::operator_new(0x78,graph_00);
  (this_02->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_02->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_02->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_02->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_02->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_02->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this_02->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_02->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_02->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(NS **)&(this_02->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u =
       graph_02;
  *(__index_type *)
   ((long)&(this_02->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x03';
  puVar2 = (undefined8 *)N::operator_new(0x78,graph_01);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  *(undefined4 *)(puVar2 + 10) = 0;
  *(undefined1 *)(puVar2 + 0xe) = 1;
  puVar2 = (undefined8 *)N::operator_new(0x78,graph_02);
  pNVar1 = local_48;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  *(undefined4 *)(puVar2 + 10) = 1;
  *(undefined1 *)(puVar2 + 0xe) = 1;
  this_03 = (N *)N::operator_new(0x78,local_48);
  N::N<char_const*>(this_03,"sib");
  local_40 = (N *)N::operator_new(0x78,pNVar1);
  N::N<char_const*>(local_40,"child");
  iVar3 = (int)this_03;
  local_50 = this_00;
  N::connect(this,iVar3,(sockaddr *)&local_50,1);
  local_50 = this;
  N::connect(this_00,iVar3,(sockaddr *)&local_50,1);
  local_50 = this_02;
  N::connect(this_01,iVar3,(sockaddr *)&local_50,1);
  local_50 = this_01;
  N::connect(this_02,iVar3,(sockaddr *)&local_50,1);
  iVar3 = (int)local_40;
  local_50 = this_01;
  N::connect(this,iVar3,(sockaddr *)&local_50,1);
  local_50 = this_02;
  N::connect(this_00,iVar3,(sockaddr *)&local_50,1);
  *(NS **)local_38.super__Head_base<0UL,_NS_*,_false>._M_head_impl = local_48;
  return (tuple<NS_*>)local_38.super__Head_base<0UL,_NS_*,_false>._M_head_impl;
}

Assistant:

std::tuple<NS*> double_nested() {
        auto g0 = new NS(), g1a = new NS(), g1b = new NS(), g2a = new NS(), g2b = new NS();
        auto a = new(g0) N(g1a), b = new(g0) N(g1b);
        auto x = new(g1a) N(g2a), y = new(g1b) N(g2b);
        auto xm = new(g2a) N(0), ym = new(g2b) N(1);

        auto s = new(g0) N("sib"), c = new(g0) N("child");

        a->connect(s, {b}); b->connect(s, {a});
        x->connect(s, {y}); y->connect(s, {x});

        a->connect(c, {x}); b->connect(c, {y});


        return {g0,};
    }